

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void assign_adjust(LexState *ls,BCReg nvars,BCReg nexps,ExpDesc *e)

{
  BCReg n;
  BCReg BVar1;
  
  n = nvars - nexps;
  if (e->k != VVOID) {
    if (e->k == VCALL) {
      BVar1 = 0xffffffff;
      if (-1 < (int)n) {
        BVar1 = n;
      }
      ls->rfunc[(ulong)(e->u).s.info * 8 + 3] =
           (_func_char_ptr_lua_State_ptr_void_ptr_size_t_ptr)((char)BVar1 + '\x02');
      if ((int)n < 1) {
        return;
      }
      bcreg_reserve((FuncState *)ls,BVar1);
      return;
    }
    expr_tonextreg((FuncState *)ls,e);
  }
  if ((int)n < 1) {
    return;
  }
  BVar1 = *(BCReg *)((long)&ls->p + 4);
  bcreg_reserve((FuncState *)ls,n);
  bcemit_nil((FuncState *)ls,BVar1,n);
  return;
}

Assistant:

static void assign_adjust(LexState *ls, BCReg nvars, BCReg nexps, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  int32_t extra = (int32_t)nvars - (int32_t)nexps;
  if (e->k == VCALL) {
    extra++;  /* Compensate for the VCALL itself. */
    if (extra < 0) extra = 0;
    setbc_b(bcptr(fs, e), extra+1);  /* Fixup call results. */
    if (extra > 1) bcreg_reserve(fs, (BCReg)extra-1);
  } else {
    if (e->k != VVOID)
      expr_tonextreg(fs, e);  /* Close last expression. */
    if (extra > 0) {  /* Leftover LHS are set to nil. */
      BCReg reg = fs->freereg;
      bcreg_reserve(fs, (BCReg)extra);
      bcemit_nil(fs, reg, (BCReg)extra);
    }
  }
}